

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

ScanVectorType __thiscall
duckdb::ColumnData::GetVectorScanType
          (ColumnData *this,ColumnScanState *state,idx_t scan_count,Vector *result)

{
  bool bVar1;
  ScanVectorType SVar2;
  
  if (result->vector_type != FLAT_VECTOR) {
    return SCAN_ENTIRE_VECTOR;
  }
  bVar1 = HasUpdates(this);
  if (bVar1) {
    SVar2 = SCAN_FLAT_VECTOR;
  }
  else {
    SVar2 = (ScanVectorType)
            (((state->current->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>._M_i +
             (state->current->super_SegmentBase<duckdb::ColumnSegment>).start) - state->row_index <
            scan_count);
  }
  return SVar2;
}

Assistant:

ScanVectorType ColumnData::GetVectorScanType(ColumnScanState &state, idx_t scan_count, Vector &result) {
	if (result.GetVectorType() != VectorType::FLAT_VECTOR) {
		return ScanVectorType::SCAN_ENTIRE_VECTOR;
	}
	if (HasUpdates()) {
		// if we have updates we need to merge in the updates
		// always need to scan flat vectors
		return ScanVectorType::SCAN_FLAT_VECTOR;
	}
	// check if the current segment has enough data remaining
	idx_t remaining_in_segment = state.current->start + state.current->count - state.row_index;
	if (remaining_in_segment < scan_count) {
		// there is not enough data remaining in the current segment so we need to scan across segments
		// we need flat vectors here
		return ScanVectorType::SCAN_FLAT_VECTOR;
	}
	return ScanVectorType::SCAN_ENTIRE_VECTOR;
}